

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.c
# Opt level: O0

_Bool compare_submesh_geometry(scene_node *left,scene_node *right)

{
  _Bool local_29;
  submesh_geometry *right_submesh_geometry;
  submesh_geometry *left_submesh_geometry;
  scene_node *right_local;
  scene_node *left_local;
  
  if ((left->type == SUBMESH_GEOMETRY) && (left->type == right->type)) {
    local_29 = false;
    if ((left[2].hash == right[2].hash) && (local_29 = false, left[2].compare == right[2].compare))
    {
      local_29 = left[2].cleanup == right[2].cleanup;
    }
    return local_29;
  }
  __assert_fail("left->type == SUBMESH_GEOMETRY && left->type == right->type",
                "/workspace/llm4binary/github/license_all_cmakelists_25/madmann91[P]rt/src/scene/geometry.c"
                ,0x67,
                "_Bool compare_submesh_geometry(const struct scene_node *, const struct scene_node *)"
               );
}

Assistant:

static bool compare_submesh_geometry(const struct scene_node* left, const struct scene_node* right) {
    assert(left->type == SUBMESH_GEOMETRY && left->type == right->type);
    struct submesh_geometry* left_submesh_geometry  = (void*)left;
    struct submesh_geometry* right_submesh_geometry = (void*)right;
    return
        left_submesh_geometry->mesh  == right_submesh_geometry->mesh &&
        left_submesh_geometry->begin == right_submesh_geometry->begin &&
        left_submesh_geometry->end   == right_submesh_geometry->end;
}